

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

int32_t adt_ary_indexOf(adt_ary_t *self,void *pElem)

{
  long lVar1;
  
  if ((self != (adt_ary_t *)0x0) && (0 < (long)self->s32CurLen)) {
    lVar1 = 0;
    do {
      if (self->pFirst[lVar1] == pElem) {
        return (int32_t)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (self->s32CurLen != lVar1);
  }
  return -1;
}

Assistant:

int32_t adt_ary_indexOf(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem) {
            return s32Index;
         }
      }
   }
   return -1;
}